

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall czh::parser::Parser::parse_id(Parser *this)

{
  Value *_value;
  Token *this_00;
  TokenType TVar1;
  bool bVar2;
  Node *pNVar3;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_name;
  Token bak;
  allocator<char> local_2c9;
  source_location local_2c8;
  Reference local_2c0;
  Token local_2a8;
  string local_258;
  Token local_238;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  Token local_168;
  Token local_118;
  Token local_c8;
  Token local_78;
  
  if (this->lex->is_eof != false) {
    return;
  }
  _value = &(this->curr_tok).what;
  local_238._0_8_ = &PTR_s__workspace_llm4binary_github_lic_001953b8;
  value::Value::
  internal_get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (&local_258,_value,&local_238);
  local_238._0_8_ = &PTR_s__workspace_llm4binary_github_lic_001953d0;
  bVar2 = node::Node::has_node(this->curr_node,&local_258,(source_location *)&local_238);
  this_00 = &this->curr_tok;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Duplicate node name.",(allocator<char> *)&local_2a8);
    token::Token::report_error(this_00,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  token::Token::Token(&local_238,this_00);
  get(&local_2a8,this);
  token::Token::operator=(this_00,&local_2a8);
  token::Token::~Token(&local_2a8);
  if (this_00->type == COLON) {
    get(&local_2a8,this);
    token::Token::operator=(this_00,&local_2a8);
    token::Token::~Token(&local_2a8);
    pNVar3 = this->curr_node;
    std::__cxx11::string::string((string *)&local_188,&local_258);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"",(allocator<char> *)&local_2c8);
    token::Token::Token(&local_78,&local_238);
    local_2c0.path.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR_s__workspace_llm4binary_github_lic_001953e8;
    pNVar3 = node::Node::add_node
                       (pNVar3,&local_188,(string *)&local_2a8,&local_78,
                        (source_location *)&local_2c0);
    this->curr_node = pNVar3;
    token::Token::~Token(&local_78);
    std::__cxx11::string::~string((string *)&local_2a8);
    this_01 = &local_188;
  }
  else {
    get(&local_2a8,this);
    token::Token::operator=(this_00,&local_2a8);
    token::Token::~Token(&local_2a8);
    TVar1 = this_00->type;
    if (TVar1 != REF) {
      if (TVar1 == ARR_LP) {
        pNVar3 = this->curr_node;
        std::__cxx11::string::string((string *)&local_1c8,&local_258);
        parse_array_abi_cxx11_((Array *)&local_2c0,this);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2c9);
        token::Token::Token(&local_118,&local_238);
        local_2c8._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195418;
        node::Node::
        add<std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>,void>
                  (pNVar3,&local_1c8,
                   (vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_2c0,(string *)&local_2a8,&local_118,&local_2c8);
        token::Token::~Token(&local_118);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::
        vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_2c0);
        this_01 = &local_1c8;
        goto LAB_00116ab3;
      }
      if (TVar1 != ID) {
        pNVar3 = this->curr_node;
        std::__cxx11::string::string((string *)&local_1e8,&local_258);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"",(allocator<char> *)&local_2c8);
        token::Token::Token(&local_168,&local_238);
        local_2c0.path.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&PTR_s__workspace_llm4binary_github_lic_00195430;
        node::Node::add<czh::value::Value&,void>
                  (pNVar3,&local_1e8,_value,(string *)&local_2a8,&local_168,
                   (source_location *)&local_2c0);
        token::Token::~Token(&local_168);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_1e8);
        get(&local_2a8,this);
        token::Token::operator=(this_00,&local_2a8);
        token::Token::~Token(&local_2a8);
        goto LAB_00116ab8;
      }
    }
    pNVar3 = this->curr_node;
    std::__cxx11::string::string((string *)&local_1a8,&local_258);
    parse_ref(&local_2c0,this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2c9);
    token::Token::Token(&local_c8,&local_238);
    local_2c8._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195400;
    node::Node::add<czh::value::Reference,void>
              (pNVar3,&local_1a8,&local_2c0,(string *)&local_2a8,&local_c8,&local_2c8);
    token::Token::~Token(&local_c8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c0.path);
    this_01 = &local_1a8;
  }
LAB_00116ab3:
  std::__cxx11::string::~string((string *)this_01);
LAB_00116ab8:
  token::Token::~Token(&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  return;
}

Assistant:

bool check()
    {
      return !lex->eof();
    }